

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::CreateScriptContext_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  JsRTCreateScriptContextAction *pJVar1;
  JsRTCreateScriptContextAction_KnownObjects *pJVar2;
  TTD_LOG_PTR_ID TVar3;
  JsRTCreateScriptContextAction *cAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCreateScriptContextAction,(TTD::NSLogEvents::EventKind)17>
                     (evt);
  pJVar2 = SlabAllocatorBase<8>::
           SlabAllocateStruct<TTD::NSLogEvents::JsRTCreateScriptContextAction_KnownObjects>(alloc);
  pJVar1->KnownObjects = pJVar2;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  TVar3 = FileReader::ReadLogTag(reader,logTag,false);
  pJVar1->GlobalObject = TVar3;
  TVar3 = FileReader::ReadLogTag(reader,logTag,true);
  pJVar1->KnownObjects->UndefinedObject = TVar3;
  TVar3 = FileReader::ReadLogTag(reader,logTag,true);
  pJVar1->KnownObjects->NullObject = TVar3;
  TVar3 = FileReader::ReadLogTag(reader,logTag,true);
  pJVar1->KnownObjects->TrueObject = TVar3;
  TVar3 = FileReader::ReadLogTag(reader,logTag,true);
  pJVar1->KnownObjects->FalseObject = TVar3;
  (*reader->_vptr_FileReader[5])();
  return;
}

Assistant:

void CreateScriptContext_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTCreateScriptContextAction* cAction = GetInlineEventDataAs<JsRTCreateScriptContextAction, EventKind::CreateScriptContextActionTag>(evt);
            cAction->KnownObjects = alloc.SlabAllocateStruct<JsRTCreateScriptContextAction_KnownObjects>();

            reader->ReadSequenceStart_WDefaultKey(true);
            cAction->GlobalObject = reader->ReadLogTag(NSTokens::Key::logTag, false);
            cAction->KnownObjects->UndefinedObject = reader->ReadLogTag(NSTokens::Key::logTag, true);
            cAction->KnownObjects->NullObject = reader->ReadLogTag(NSTokens::Key::logTag, true);
            cAction->KnownObjects->TrueObject = reader->ReadLogTag(NSTokens::Key::logTag, true);
            cAction->KnownObjects->FalseObject = reader->ReadLogTag(NSTokens::Key::logTag, true);
            reader->ReadSequenceEnd();
        }